

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

BBox3fa * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
::vbounds(BBox3fa *__return_storage_ptr__,
         CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
         *this,LinearSpace3fa *space,size_t i)

{
  float fVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  uint uVar5;
  BufferView<embree::Vec3fx> *pBVar6;
  char *pcVar7;
  size_t sVar8;
  char *pcVar9;
  byte bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  ulong uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined4 uVar69;
  undefined1 auVar70 [32];
  undefined1 auVar71 [64];
  undefined1 auVar72 [32];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [16];
  undefined4 uVar78;
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined4 uVar82;
  undefined1 auVar83 [16];
  undefined1 auVar84 [32];
  
  pBVar6 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           vertices.items;
  uVar5 = *(uint *)(*(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                              super_CurveGeometry.super_Geometry.field_0x58 +
                   i * *(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                                 super_CurveGeometry.field_0x68);
  pcVar7 = (pBVar6->super_RawBufferView).ptr_ofs;
  sVar8 = (pBVar6->super_RawBufferView).stride;
  lVar27 = sVar8 * uVar5;
  lVar26 = sVar8 * (uVar5 + 1);
  pBVar6 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           tangents.items;
  pcVar9 = (pBVar6->super_RawBufferView).ptr_ofs;
  sVar8 = (pBVar6->super_RawBufferView).stride;
  lVar24 = uVar5 * sVar8;
  lVar25 = sVar8 * (uVar5 + 1);
  aVar2 = (space->vx).field_0;
  aVar3 = (space->vy).field_0;
  aVar4 = (space->vz).field_0;
  uVar69 = *(undefined4 *)(pcVar7 + lVar27 + 8);
  auVar28._4_4_ = uVar69;
  auVar28._0_4_ = uVar69;
  auVar28._8_4_ = uVar69;
  auVar28._12_4_ = uVar69;
  auVar28 = vmulps_avx512vl((undefined1  [16])aVar4,auVar28);
  uVar69 = *(undefined4 *)(pcVar7 + lVar27 + 4);
  auVar30._4_4_ = uVar69;
  auVar30._0_4_ = uVar69;
  auVar30._8_4_ = uVar69;
  auVar30._12_4_ = uVar69;
  auVar28 = vfmadd231ps_avx512vl(auVar28,(undefined1  [16])aVar3,auVar30);
  uVar69 = *(undefined4 *)(pcVar7 + lVar27);
  auVar32._4_4_ = uVar69;
  auVar32._0_4_ = uVar69;
  auVar32._8_4_ = uVar69;
  auVar32._12_4_ = uVar69;
  auVar29 = vfmadd231ps_avx512vl(auVar28,(undefined1  [16])aVar2,auVar32);
  fVar1 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
          maxRadiusScale;
  fVar18 = fVar1 * *(float *)(pcVar7 + lVar27 + 0xc);
  uVar69 = *(undefined4 *)(pcVar7 + lVar26 + 8);
  auVar33._4_4_ = uVar69;
  auVar33._0_4_ = uVar69;
  auVar33._8_4_ = uVar69;
  auVar33._12_4_ = uVar69;
  auVar28 = vmulps_avx512vl((undefined1  [16])aVar4,auVar33);
  uVar69 = *(undefined4 *)(pcVar7 + lVar26 + 4);
  auVar31._4_4_ = uVar69;
  auVar31._0_4_ = uVar69;
  auVar31._8_4_ = uVar69;
  auVar31._12_4_ = uVar69;
  auVar30 = vfmadd231ps_avx512vl(auVar28,(undefined1  [16])aVar3,auVar31);
  auVar28 = vinsertps_avx(auVar29,ZEXT416((uint)fVar18),0x30);
  uVar69 = *(undefined4 *)(pcVar7 + lVar26);
  auVar20._4_4_ = uVar69;
  auVar20._0_4_ = uVar69;
  auVar20._8_4_ = uVar69;
  auVar20._12_4_ = uVar69;
  auVar31 = vfmadd231ps_avx512vl(auVar30,(undefined1  [16])aVar2,auVar20);
  fVar19 = fVar1 * *(float *)(pcVar7 + lVar26 + 0xc);
  auVar30 = vinsertps_avx(auVar31,ZEXT416((uint)fVar19),0x30);
  uVar69 = *(undefined4 *)(pcVar9 + lVar24 + 8);
  auVar38._4_4_ = uVar69;
  auVar38._0_4_ = uVar69;
  auVar38._8_4_ = uVar69;
  auVar38._12_4_ = uVar69;
  auVar32 = vmulps_avx512vl((undefined1  [16])aVar4,auVar38);
  uVar69 = *(undefined4 *)(pcVar9 + lVar24 + 4);
  auVar39._4_4_ = uVar69;
  auVar39._0_4_ = uVar69;
  auVar39._8_4_ = uVar69;
  auVar39._12_4_ = uVar69;
  auVar32 = vfmadd231ps_avx512vl(auVar32,(undefined1  [16])aVar3,auVar39);
  uVar69 = *(undefined4 *)(pcVar9 + lVar24);
  auVar34._4_4_ = uVar69;
  auVar34._0_4_ = uVar69;
  auVar34._8_4_ = uVar69;
  auVar34._12_4_ = uVar69;
  auVar32 = vfmadd231ps_avx512vl(auVar32,(undefined1  [16])aVar2,auVar34);
  uVar69 = *(undefined4 *)(pcVar9 + lVar25 + 8);
  auVar35._4_4_ = uVar69;
  auVar35._0_4_ = uVar69;
  auVar35._8_4_ = uVar69;
  auVar35._12_4_ = uVar69;
  auVar33 = vmulps_avx512vl((undefined1  [16])aVar4,auVar35);
  uVar69 = *(undefined4 *)(pcVar9 + lVar25 + 4);
  auVar36._4_4_ = uVar69;
  auVar36._0_4_ = uVar69;
  auVar36._8_4_ = uVar69;
  auVar36._12_4_ = uVar69;
  auVar33 = vfmadd231ps_avx512vl(auVar33,(undefined1  [16])aVar3,auVar36);
  auVar32 = vinsertps_avx(auVar32,ZEXT416((uint)(fVar1 * *(float *)(pcVar9 + lVar24 + 0xc))),0x30);
  uVar69 = *(undefined4 *)(pcVar9 + lVar25);
  auVar37._4_4_ = uVar69;
  auVar37._0_4_ = uVar69;
  auVar37._8_4_ = uVar69;
  auVar37._12_4_ = uVar69;
  auVar33 = vfmadd231ps_avx512vl(auVar33,(undefined1  [16])aVar2,auVar37);
  auVar33 = vinsertps_avx(auVar33,ZEXT416((uint)(fVar1 * *(float *)(pcVar9 + lVar25 + 0xc))),0x30);
  auVar73._8_4_ = 0xbeaaaaab;
  auVar73._0_8_ = 0xbeaaaaabbeaaaaab;
  auVar73._12_4_ = 0xbeaaaaab;
  auVar32 = vfnmadd213ps_fma(auVar32,auVar73,auVar28);
  auVar28 = vfmadd213ps_fma(auVar33,auVar73,auVar30);
  lVar24 = (long)(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                 super_CurveGeometry.tessellationRate;
  uVar69 = auVar29._0_4_;
  uVar82 = auVar32._0_4_;
  uVar78 = auVar28._0_4_;
  if (lVar24 == 4) {
    auVar74._4_4_ = uVar69;
    auVar74._0_4_ = uVar69;
    auVar74._8_4_ = uVar69;
    auVar74._12_4_ = uVar69;
    auVar33 = vshufps_avx(auVar29,auVar29,0x55);
    auVar20 = vshufps_avx(auVar29,auVar29,0xaa);
    auVar77._4_4_ = fVar18;
    auVar77._0_4_ = fVar18;
    auVar77._8_4_ = fVar18;
    auVar77._12_4_ = fVar18;
    auVar79._4_4_ = uVar82;
    auVar79._0_4_ = uVar82;
    auVar79._8_4_ = uVar82;
    auVar79._12_4_ = uVar82;
    auVar38 = vshufps_avx(auVar32,auVar32,0x55);
    auVar39 = vshufps_avx(auVar32,auVar32,0xaa);
    auVar32 = vshufps_avx(auVar32,auVar32,0xff);
    auVar83._4_4_ = uVar78;
    auVar83._0_4_ = uVar78;
    auVar83._8_4_ = uVar78;
    auVar83._12_4_ = uVar78;
    auVar34 = vshufps_avx512vl(auVar28,auVar28,0x55);
    auVar35 = vshufps_avx512vl(auVar28,auVar28,0xaa);
    auVar28 = vshufps_avx(auVar28,auVar28,0xff);
    auVar36 = vbroadcastss_avx512vl(auVar31);
    auVar37 = vshufps_avx512vl(auVar31,auVar31,0x55);
    auVar31 = vshufps_avx(auVar31,auVar31,0xaa);
    auVar29 = vbroadcastss_avx512vl(ZEXT416((uint)fVar19));
    auVar36 = vmulps_avx512vl(auVar36,bezier_basis0._3740_16_);
    auVar37 = vmulps_avx512vl(auVar37,bezier_basis0._3740_16_);
    auVar31 = vmulps_avx512vl(auVar31,bezier_basis0._3740_16_);
    auVar29 = vmulps_avx512vl(auVar29,bezier_basis0._3740_16_);
    auVar36 = vfmadd231ps_avx512vl(auVar36,bezier_basis0._2584_16_,auVar83);
    auVar34 = vfmadd231ps_avx512vl(auVar37,bezier_basis0._2584_16_,auVar34);
    auVar31 = vfmadd231ps_avx512vl(auVar31,bezier_basis0._2584_16_,auVar35);
    auVar35 = vfmadd231ps_avx512vl(auVar29,bezier_basis0._2584_16_,auVar28);
    auVar36 = vfmadd231ps_avx512vl(auVar36,bezier_basis0._1428_16_,auVar79);
    auVar38 = vfmadd231ps_avx512vl(auVar34,bezier_basis0._1428_16_,auVar38);
    auVar28 = vfmadd231ps_fma(auVar31,bezier_basis0._1428_16_,auVar39);
    auVar32 = vfmadd231ps_avx512vl(auVar35,bezier_basis0._1428_16_,auVar32);
    auVar39 = vfmadd231ps_avx512vl(auVar36,bezier_basis0._272_16_,auVar74);
    auVar38 = vfmadd231ps_avx512vl(auVar38,bezier_basis0._272_16_,auVar33);
    auVar20 = vfmadd231ps_fma(auVar28,bezier_basis0._272_16_,auVar20);
    auVar34 = vfmadd231ps_avx512vl(auVar32,bezier_basis0._272_16_,auVar77);
    auVar35 = vshufps_avx512vl(auVar39,auVar39,0xb1);
    auVar32 = vminps_avx512vl(auVar35,auVar39);
    auVar28 = vshufpd_avx(auVar32,auVar32,1);
    auVar28 = vminps_avx(auVar28,auVar32);
    auVar36 = vshufps_avx512vl(auVar38,auVar38,0xb1);
    auVar33 = vminps_avx512vl(auVar36,auVar38);
    auVar32 = vshufpd_avx(auVar33,auVar33,1);
    auVar32 = vminps_avx(auVar32,auVar33);
    auVar28 = vinsertps_avx(auVar28,auVar32,0x1c);
    auVar31 = vshufps_avx(auVar20,auVar20,0xb1);
    auVar32 = vminps_avx(auVar31,auVar20);
    auVar33 = vshufpd_avx(auVar32,auVar32,1);
    auVar32 = vminps_avx(auVar33,auVar32);
    auVar28 = vinsertps_avx(auVar28,auVar32,0x20);
    auVar33 = vmaxps_avx512vl(auVar35,auVar39);
    auVar32 = vshufpd_avx(auVar33,auVar33,1);
    auVar32 = vmaxps_avx(auVar32,auVar33);
    auVar38 = vmaxps_avx512vl(auVar36,auVar38);
    auVar33 = vshufpd_avx(auVar38,auVar38,1);
    auVar33 = vmaxps_avx(auVar33,auVar38);
    auVar32 = vinsertps_avx(auVar32,auVar33,0x1c);
    auVar33 = vmaxps_avx(auVar31,auVar20);
    auVar31 = vshufpd_avx(auVar33,auVar33,1);
    auVar33 = vmaxps_avx(auVar31,auVar33);
    auVar22._8_4_ = 0x7fffffff;
    auVar22._0_8_ = 0x7fffffff7fffffff;
    auVar22._12_4_ = 0x7fffffff;
    auVar31 = vandps_avx512vl(auVar34,auVar22);
    auVar32 = vinsertps_avx(auVar32,auVar33,0x20);
    auVar33 = vprolq_avx512vl(auVar31,0x20);
    auVar33 = vmaxps_avx(auVar33,auVar31);
    uVar69 = auVar33._0_4_;
    auVar75._4_4_ = uVar69;
    auVar75._0_4_ = uVar69;
    auVar75._8_4_ = uVar69;
    auVar75._12_4_ = uVar69;
    auVar33 = vshufps_avx(auVar33,auVar33,0xaa);
    auVar29 = vmaxps_avx(auVar33,auVar75);
  }
  else {
    auVar40 = vpbroadcastd_avx512vl();
    auVar76._4_4_ = uVar69;
    auVar76._0_4_ = uVar69;
    auVar76._8_4_ = uVar69;
    auVar76._12_4_ = uVar69;
    auVar76._16_4_ = uVar69;
    auVar76._20_4_ = uVar69;
    auVar76._24_4_ = uVar69;
    auVar76._28_4_ = uVar69;
    auVar41 = vbroadcastss_avx512vl(ZEXT416(1));
    auVar42 = vbroadcastss_avx512vl(ZEXT416(2));
    auVar43 = vpermps_avx512vl(auVar41,ZEXT1632(auVar29));
    auVar44 = vpermps_avx512vl(auVar42,ZEXT1632(auVar29));
    auVar80._4_4_ = fVar18;
    auVar80._0_4_ = fVar18;
    auVar80._8_4_ = fVar18;
    auVar80._12_4_ = fVar18;
    auVar80._16_4_ = fVar18;
    auVar80._20_4_ = fVar18;
    auVar80._24_4_ = fVar18;
    auVar80._28_4_ = fVar18;
    auVar81._4_4_ = uVar82;
    auVar81._0_4_ = uVar82;
    auVar81._8_4_ = uVar82;
    auVar81._12_4_ = uVar82;
    auVar81._16_4_ = uVar82;
    auVar81._20_4_ = uVar82;
    auVar81._24_4_ = uVar82;
    auVar81._28_4_ = uVar82;
    auVar62 = ZEXT1632(auVar32);
    auVar45 = vpermps_avx512vl(auVar41,auVar62);
    auVar46 = vpermps_avx512vl(auVar42,auVar62);
    auVar72._8_4_ = 3;
    auVar72._0_8_ = 0x300000003;
    auVar72._12_4_ = 3;
    auVar72._16_4_ = 3;
    auVar72._20_4_ = 3;
    auVar72._24_4_ = 3;
    auVar72._28_4_ = 3;
    auVar62 = vpermps_avx2(auVar72,auVar62);
    auVar84._4_4_ = uVar78;
    auVar84._0_4_ = uVar78;
    auVar84._8_4_ = uVar78;
    auVar84._12_4_ = uVar78;
    auVar84._16_4_ = uVar78;
    auVar84._20_4_ = uVar78;
    auVar84._24_4_ = uVar78;
    auVar84._28_4_ = uVar78;
    auVar64 = ZEXT1632(auVar28);
    auVar47 = vpermps_avx512vl(auVar41,auVar64);
    auVar48 = vpermps_avx512vl(auVar42,auVar64);
    auVar49 = vpermps_avx512vl(auVar72,auVar64);
    auVar50 = vbroadcastss_avx512vl(auVar31);
    auVar51 = vpermps_avx512vl(auVar41,ZEXT1632(auVar31));
    auVar52 = vpermps_avx512vl(auVar42,ZEXT1632(auVar31));
    auVar53 = vbroadcastss_avx512vl(ZEXT416((uint)fVar19));
    lVar25 = lVar24 * 0x44;
    auVar54 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
    auVar41._8_4_ = 0xff800000;
    auVar41._0_8_ = 0xff800000ff800000;
    auVar41._12_4_ = 0xff800000;
    auVar41._16_4_ = 0xff800000;
    auVar41._20_4_ = 0xff800000;
    auVar41._24_4_ = 0xff800000;
    auVar41._28_4_ = 0xff800000;
    auVar71 = ZEXT864(0) << 0x20;
    lVar26 = 0;
    auVar55 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar42 = auVar41;
    auVar72 = auVar41;
    auVar63 = auVar54;
    auVar64 = auVar54;
    for (; auVar70 = auVar71._0_32_, lVar26 < lVar24; lVar26 = lVar26 + 8) {
      auVar56 = vpbroadcastd_avx512vl();
      auVar57 = vpord_avx512vl(auVar56,_DAT_01fb4ba0);
      auVar56 = *(undefined1 (*) [32])(lVar25 + 0x21fbbec + lVar26 * 4);
      auVar60 = *(undefined1 (*) [32])(lVar25 + 0x21fc070 + lVar26 * 4);
      uVar21 = vpcmpgtd_avx512vl(auVar40,auVar57);
      auVar57 = vmulps_avx512vl(auVar50,auVar60);
      auVar58 = vmulps_avx512vl(auVar51,auVar60);
      auVar59 = vmulps_avx512vl(auVar52,auVar60);
      auVar60 = vmulps_avx512vl(auVar53,auVar60);
      auVar57 = vfmadd231ps_avx512vl(auVar57,auVar56,auVar84);
      auVar58 = vfmadd231ps_avx512vl(auVar58,auVar56,auVar47);
      auVar59 = vfmadd231ps_avx512vl(auVar59,auVar56,auVar48);
      auVar60 = vfmadd231ps_avx512vl(auVar60,auVar49,auVar56);
      auVar56 = *(undefined1 (*) [32])(lVar25 + 0x21fb768 + lVar26 * 4);
      auVar57 = vfmadd231ps_avx512vl(auVar57,auVar56,auVar81);
      auVar58 = vfmadd231ps_avx512vl(auVar58,auVar56,auVar45);
      auVar59 = vfmadd231ps_avx512vl(auVar59,auVar56,auVar46);
      auVar60 = vfmadd231ps_avx512vl(auVar60,auVar62,auVar56);
      auVar56 = *(undefined1 (*) [32])(bezier_basis0 + lVar26 * 4 + lVar25);
      auVar57 = vfmadd231ps_avx512vl(auVar57,auVar56,auVar76);
      auVar58 = vfmadd231ps_avx512vl(auVar58,auVar56,auVar43);
      auVar59 = vfmadd231ps_avx512vl(auVar59,auVar56,auVar44);
      auVar56 = vfmadd231ps_avx512vl(auVar60,auVar80,auVar56);
      auVar61 = vminps_avx512vl(auVar63,auVar57);
      bVar10 = (byte)uVar21;
      auVar60._0_4_ = (uint)(bVar10 & 1) * auVar61._0_4_ | (uint)!(bool)(bVar10 & 1) * auVar63._0_4_
      ;
      bVar11 = (bool)((byte)(uVar21 >> 1) & 1);
      auVar60._4_4_ = (uint)bVar11 * auVar61._4_4_ | (uint)!bVar11 * auVar63._4_4_;
      bVar11 = (bool)((byte)(uVar21 >> 2) & 1);
      auVar60._8_4_ = (uint)bVar11 * auVar61._8_4_ | (uint)!bVar11 * auVar63._8_4_;
      bVar11 = (bool)((byte)(uVar21 >> 3) & 1);
      auVar60._12_4_ = (uint)bVar11 * auVar61._12_4_ | (uint)!bVar11 * auVar63._12_4_;
      bVar11 = (bool)((byte)(uVar21 >> 4) & 1);
      auVar60._16_4_ = (uint)bVar11 * auVar61._16_4_ | (uint)!bVar11 * auVar63._16_4_;
      bVar11 = (bool)((byte)(uVar21 >> 5) & 1);
      auVar60._20_4_ = (uint)bVar11 * auVar61._20_4_ | (uint)!bVar11 * auVar63._20_4_;
      bVar11 = (bool)((byte)(uVar21 >> 6) & 1);
      auVar60._24_4_ = (uint)bVar11 * auVar61._24_4_ | (uint)!bVar11 * auVar63._24_4_;
      bVar11 = SUB81(uVar21 >> 7,0);
      auVar60._28_4_ = (uint)bVar11 * auVar61._28_4_ | (uint)!bVar11 * auVar63._28_4_;
      auVar57 = vmaxps_avx512vl(auVar42,auVar57);
      auVar63._0_4_ = (uint)(bVar10 & 1) * auVar57._0_4_ | (uint)!(bool)(bVar10 & 1) * auVar42._0_4_
      ;
      bVar11 = (bool)((byte)(uVar21 >> 1) & 1);
      auVar63._4_4_ = (uint)bVar11 * auVar57._4_4_ | (uint)!bVar11 * auVar42._4_4_;
      bVar11 = (bool)((byte)(uVar21 >> 2) & 1);
      auVar63._8_4_ = (uint)bVar11 * auVar57._8_4_ | (uint)!bVar11 * auVar42._8_4_;
      bVar11 = (bool)((byte)(uVar21 >> 3) & 1);
      auVar63._12_4_ = (uint)bVar11 * auVar57._12_4_ | (uint)!bVar11 * auVar42._12_4_;
      bVar11 = (bool)((byte)(uVar21 >> 4) & 1);
      auVar63._16_4_ = (uint)bVar11 * auVar57._16_4_ | (uint)!bVar11 * auVar42._16_4_;
      bVar11 = (bool)((byte)(uVar21 >> 5) & 1);
      auVar63._20_4_ = (uint)bVar11 * auVar57._20_4_ | (uint)!bVar11 * auVar42._20_4_;
      bVar11 = (bool)((byte)(uVar21 >> 6) & 1);
      auVar63._24_4_ = (uint)bVar11 * auVar57._24_4_ | (uint)!bVar11 * auVar42._24_4_;
      bVar11 = SUB81(uVar21 >> 7,0);
      auVar63._28_4_ = (uint)bVar11 * auVar57._28_4_ | (uint)!bVar11 * auVar42._28_4_;
      auVar42 = vminps_avx512vl(auVar64,auVar58);
      auVar57._0_4_ = (uint)(bVar10 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar10 & 1) * auVar64._0_4_
      ;
      bVar11 = (bool)((byte)(uVar21 >> 1) & 1);
      auVar57._4_4_ = (uint)bVar11 * auVar42._4_4_ | (uint)!bVar11 * auVar64._4_4_;
      bVar11 = (bool)((byte)(uVar21 >> 2) & 1);
      auVar57._8_4_ = (uint)bVar11 * auVar42._8_4_ | (uint)!bVar11 * auVar64._8_4_;
      bVar11 = (bool)((byte)(uVar21 >> 3) & 1);
      auVar57._12_4_ = (uint)bVar11 * auVar42._12_4_ | (uint)!bVar11 * auVar64._12_4_;
      bVar11 = (bool)((byte)(uVar21 >> 4) & 1);
      auVar57._16_4_ = (uint)bVar11 * auVar42._16_4_ | (uint)!bVar11 * auVar64._16_4_;
      bVar11 = (bool)((byte)(uVar21 >> 5) & 1);
      auVar57._20_4_ = (uint)bVar11 * auVar42._20_4_ | (uint)!bVar11 * auVar64._20_4_;
      bVar11 = (bool)((byte)(uVar21 >> 6) & 1);
      auVar57._24_4_ = (uint)bVar11 * auVar42._24_4_ | (uint)!bVar11 * auVar64._24_4_;
      bVar11 = SUB81(uVar21 >> 7,0);
      auVar57._28_4_ = (uint)bVar11 * auVar42._28_4_ | (uint)!bVar11 * auVar64._28_4_;
      auVar42 = vmaxps_avx512vl(auVar72,auVar58);
      auVar64._0_4_ = (uint)(bVar10 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar10 & 1) * auVar72._0_4_
      ;
      bVar11 = (bool)((byte)(uVar21 >> 1) & 1);
      auVar64._4_4_ = (uint)bVar11 * auVar42._4_4_ | (uint)!bVar11 * auVar72._4_4_;
      bVar11 = (bool)((byte)(uVar21 >> 2) & 1);
      auVar64._8_4_ = (uint)bVar11 * auVar42._8_4_ | (uint)!bVar11 * auVar72._8_4_;
      bVar11 = (bool)((byte)(uVar21 >> 3) & 1);
      auVar64._12_4_ = (uint)bVar11 * auVar42._12_4_ | (uint)!bVar11 * auVar72._12_4_;
      bVar11 = (bool)((byte)(uVar21 >> 4) & 1);
      auVar64._16_4_ = (uint)bVar11 * auVar42._16_4_ | (uint)!bVar11 * auVar72._16_4_;
      bVar11 = (bool)((byte)(uVar21 >> 5) & 1);
      auVar64._20_4_ = (uint)bVar11 * auVar42._20_4_ | (uint)!bVar11 * auVar72._20_4_;
      bVar11 = (bool)((byte)(uVar21 >> 6) & 1);
      auVar64._24_4_ = (uint)bVar11 * auVar42._24_4_ | (uint)!bVar11 * auVar72._24_4_;
      bVar11 = SUB81(uVar21 >> 7,0);
      auVar64._28_4_ = (uint)bVar11 * auVar42._28_4_ | (uint)!bVar11 * auVar72._28_4_;
      auVar42 = vminps_avx512vl(auVar54,auVar59);
      auVar58._0_4_ = (uint)(bVar10 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar10 & 1) * auVar54._0_4_
      ;
      bVar11 = (bool)((byte)(uVar21 >> 1) & 1);
      auVar58._4_4_ = (uint)bVar11 * auVar42._4_4_ | (uint)!bVar11 * auVar54._4_4_;
      bVar11 = (bool)((byte)(uVar21 >> 2) & 1);
      auVar58._8_4_ = (uint)bVar11 * auVar42._8_4_ | (uint)!bVar11 * auVar54._8_4_;
      bVar11 = (bool)((byte)(uVar21 >> 3) & 1);
      auVar58._12_4_ = (uint)bVar11 * auVar42._12_4_ | (uint)!bVar11 * auVar54._12_4_;
      bVar11 = (bool)((byte)(uVar21 >> 4) & 1);
      auVar58._16_4_ = (uint)bVar11 * auVar42._16_4_ | (uint)!bVar11 * auVar54._16_4_;
      bVar11 = (bool)((byte)(uVar21 >> 5) & 1);
      auVar58._20_4_ = (uint)bVar11 * auVar42._20_4_ | (uint)!bVar11 * auVar54._20_4_;
      bVar11 = (bool)((byte)(uVar21 >> 6) & 1);
      auVar58._24_4_ = (uint)bVar11 * auVar42._24_4_ | (uint)!bVar11 * auVar54._24_4_;
      bVar11 = SUB81(uVar21 >> 7,0);
      auVar58._28_4_ = (uint)bVar11 * auVar42._28_4_ | (uint)!bVar11 * auVar54._28_4_;
      auVar42 = vmaxps_avx512vl(auVar41,auVar59);
      auVar54._0_4_ = (uint)(bVar10 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar10 & 1) * auVar41._0_4_
      ;
      bVar11 = (bool)((byte)(uVar21 >> 1) & 1);
      auVar54._4_4_ = (uint)bVar11 * auVar42._4_4_ | (uint)!bVar11 * auVar41._4_4_;
      bVar11 = (bool)((byte)(uVar21 >> 2) & 1);
      auVar54._8_4_ = (uint)bVar11 * auVar42._8_4_ | (uint)!bVar11 * auVar41._8_4_;
      bVar11 = (bool)((byte)(uVar21 >> 3) & 1);
      auVar54._12_4_ = (uint)bVar11 * auVar42._12_4_ | (uint)!bVar11 * auVar41._12_4_;
      bVar11 = (bool)((byte)(uVar21 >> 4) & 1);
      auVar54._16_4_ = (uint)bVar11 * auVar42._16_4_ | (uint)!bVar11 * auVar41._16_4_;
      bVar11 = (bool)((byte)(uVar21 >> 5) & 1);
      auVar54._20_4_ = (uint)bVar11 * auVar42._20_4_ | (uint)!bVar11 * auVar41._20_4_;
      bVar11 = (bool)((byte)(uVar21 >> 6) & 1);
      auVar54._24_4_ = (uint)bVar11 * auVar42._24_4_ | (uint)!bVar11 * auVar41._24_4_;
      bVar11 = SUB81(uVar21 >> 7,0);
      auVar54._28_4_ = (uint)bVar11 * auVar42._28_4_ | (uint)!bVar11 * auVar41._28_4_;
      vandps_avx512vl(auVar56,auVar55);
      auVar41 = vmaxps_avx512vl(auVar70,auVar54);
      bVar11 = (bool)((byte)(uVar21 >> 1) & 1);
      bVar12 = (bool)((byte)(uVar21 >> 2) & 1);
      bVar13 = (bool)((byte)(uVar21 >> 3) & 1);
      bVar14 = (bool)((byte)(uVar21 >> 4) & 1);
      bVar15 = (bool)((byte)(uVar21 >> 5) & 1);
      bVar16 = (bool)((byte)(uVar21 >> 6) & 1);
      bVar17 = SUB81(uVar21 >> 7,0);
      auVar71 = ZEXT3264(CONCAT428((uint)bVar17 * auVar41._28_4_ | (uint)!bVar17 * auVar71._28_4_,
                                   CONCAT424((uint)bVar16 * auVar41._24_4_ |
                                             (uint)!bVar16 * auVar71._24_4_,
                                             CONCAT420((uint)bVar15 * auVar41._20_4_ |
                                                       (uint)!bVar15 * auVar71._20_4_,
                                                       CONCAT416((uint)bVar14 * auVar41._16_4_ |
                                                                 (uint)!bVar14 * auVar71._16_4_,
                                                                 CONCAT412((uint)bVar13 *
                                                                           auVar41._12_4_ |
                                                                           (uint)!bVar13 *
                                                                           auVar71._12_4_,
                                                                           CONCAT48((uint)bVar12 *
                                                                                    auVar41._8_4_ |
                                                                                    (uint)!bVar12 *
                                                                                    auVar71._8_4_,
                                                                                    CONCAT44((uint)
                                                  bVar11 * auVar41._4_4_ |
                                                  (uint)!bVar11 * auVar71._4_4_,
                                                  (uint)(bVar10 & 1) * auVar41._0_4_ |
                                                  (uint)!(bool)(bVar10 & 1) * auVar71._0_4_))))))));
      auVar41 = auVar54;
      auVar42 = auVar63;
      auVar72 = auVar64;
      auVar54 = auVar58;
      auVar63 = auVar60;
      auVar64 = auVar57;
    }
    auVar62 = vshufps_avx512vl(auVar63,auVar63,0xb1);
    auVar63 = vminps_avx512vl(auVar63,auVar62);
    auVar62 = vshufpd_avx(auVar63,auVar63,5);
    auVar62 = vminps_avx(auVar63,auVar62);
    auVar28 = vminps_avx(auVar62._0_16_,auVar62._16_16_);
    auVar62 = vshufps_avx512vl(auVar64,auVar64,0xb1);
    auVar64 = vminps_avx512vl(auVar64,auVar62);
    auVar62 = vshufpd_avx(auVar64,auVar64,5);
    auVar62 = vminps_avx(auVar64,auVar62);
    auVar32 = vminps_avx(auVar62._0_16_,auVar62._16_16_);
    auVar32 = vunpcklps_avx(auVar28,auVar32);
    auVar62 = vshufps_avx512vl(auVar54,auVar54,0xb1);
    auVar64 = vminps_avx512vl(auVar54,auVar62);
    auVar62 = vshufpd_avx(auVar64,auVar64,5);
    auVar62 = vminps_avx(auVar64,auVar62);
    auVar28 = vminps_avx(auVar62._0_16_,auVar62._16_16_);
    auVar28 = vinsertps_avx(auVar32,auVar28,0x28);
    auVar62 = vshufps_avx(auVar42,auVar42,0xb1);
    auVar62 = vmaxps_avx(auVar42,auVar62);
    auVar42 = vshufpd_avx(auVar62,auVar62,5);
    auVar62 = vmaxps_avx(auVar62,auVar42);
    auVar32 = vmaxps_avx(auVar62._0_16_,auVar62._16_16_);
    auVar62 = vshufps_avx(auVar72,auVar72,0xb1);
    auVar62 = vmaxps_avx(auVar72,auVar62);
    auVar42 = vshufpd_avx(auVar62,auVar62,5);
    auVar62 = vmaxps_avx(auVar62,auVar42);
    auVar33 = vmaxps_avx(auVar62._0_16_,auVar62._16_16_);
    auVar33 = vunpcklps_avx(auVar32,auVar33);
    auVar62 = vshufps_avx(auVar41,auVar41,0xb1);
    auVar62 = vmaxps_avx(auVar41,auVar62);
    auVar41 = vshufpd_avx(auVar62,auVar62,5);
    auVar62 = vmaxps_avx(auVar62,auVar41);
    auVar32 = vmaxps_avx(auVar62._0_16_,auVar62._16_16_);
    auVar32 = vinsertps_avx(auVar33,auVar32,0x28);
    auVar62 = vshufps_avx(auVar70,auVar70,0xb1);
    auVar62 = vmaxps_avx(auVar70,auVar62);
    auVar41 = vshufpd_avx(auVar62,auVar62,5);
    auVar62 = vmaxps_avx(auVar62,auVar41);
    auVar33 = vmaxps_avx(auVar62._0_16_,auVar62._16_16_);
    auVar29._0_4_ = auVar33._0_4_;
    auVar29._4_4_ = auVar29._0_4_;
    auVar29._8_4_ = auVar29._0_4_;
    auVar29._12_4_ = auVar29._0_4_;
  }
  auVar33 = vminps_avx(auVar28,auVar30);
  auVar28 = vmaxps_avx(auVar32,auVar30);
  auVar65._4_4_ = fVar19;
  auVar65._0_4_ = fVar19;
  auVar65._8_4_ = fVar19;
  auVar65._12_4_ = fVar19;
  auVar23._8_4_ = 0x7fffffff;
  auVar23._0_8_ = 0x7fffffff7fffffff;
  auVar23._12_4_ = 0x7fffffff;
  auVar30 = vandps_avx512vl(auVar65,auVar23);
  auVar30 = vmaxps_avx(auVar29,auVar30);
  auVar32 = vsubps_avx(auVar33,auVar30);
  auVar66._0_4_ = auVar28._0_4_ + auVar30._0_4_;
  auVar66._4_4_ = auVar28._4_4_ + auVar30._4_4_;
  auVar66._8_4_ = auVar28._8_4_ + auVar30._8_4_;
  auVar66._12_4_ = auVar28._12_4_ + auVar30._12_4_;
  auVar67._8_4_ = 0x7fffffff;
  auVar67._0_8_ = 0x7fffffff7fffffff;
  auVar67._12_4_ = 0x7fffffff;
  auVar28 = vandps_avx(auVar32,auVar67);
  auVar30 = vandps_avx(auVar66,auVar67);
  auVar28 = vmaxps_avx(auVar28,auVar30);
  auVar30 = vmovshdup_avx(auVar28);
  auVar30 = vmaxss_avx(auVar30,auVar28);
  auVar28 = vshufpd_avx(auVar28,auVar28,1);
  auVar28 = vmaxss_avx(auVar28,auVar30);
  fVar1 = auVar28._0_4_ * 4.7683716e-07;
  auVar68._4_4_ = fVar1;
  auVar68._0_4_ = fVar1;
  auVar68._8_4_ = fVar1;
  auVar68._12_4_ = fVar1;
  aVar2 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar32,auVar68);
  (__return_storage_ptr__->lower).field_0 = aVar2;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar66._0_4_ + fVar1;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar66._4_4_ + fVar1;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar66._8_4_ + fVar1;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar66._12_4_ + fVar1;
  return __return_storage_ptr__;
}

Assistant:

BBox3fa vbounds(const LinearSpace3fa& space, size_t i) const {
        return bounds(space,i);
      }